

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HomeChecker.cpp
# Opt level: O1

bool __thiscall
tiger::trains::ai::HomeChecker::needHome
          (HomeChecker *this,Train *train,int len,int homeLen,GoodType type)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  int iVar3;
  int iVar4;
  Player *this_00;
  Town *this_01;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  bool bVar7;
  double dVar8;
  Train *local_40;
  double local_38;
  
  local_40 = train;
  iVar2 = world::Train::getGoods(train);
  if (iVar2 == 0) {
LAB_00150852:
    bVar7 = false;
  }
  else {
    p_Var1 = &(this->goingHomeTrain)._M_t._M_impl.super__Rb_tree_header;
    p_Var6 = (this->goingHomeTrain)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var5 = &p_Var1->_M_header;
    for (; p_Var6 != (_Base_ptr)0x0; p_Var6 = (&p_Var6->_M_left)[*(Train **)(p_Var6 + 1) < local_40]
        ) {
      if (*(Train **)(p_Var6 + 1) >= local_40) {
        p_Var5 = p_Var6;
      }
    }
    p_Var6 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
       (p_Var6 = p_Var5, local_40 < *(Train **)(p_Var5 + 1))) {
      p_Var6 = &p_Var1->_M_header;
    }
    bVar7 = true;
    if ((_Rb_tree_header *)p_Var6 != p_Var1) {
      return true;
    }
    this_00 = world::Train::getPlayer(local_40);
    this_01 = (Town *)world::Player::getHome(this_00);
    if (type == PRODUCT) {
      iVar2 = world::Town::getProduct(this_01);
      local_38 = (double)len;
      dVar8 = ceil(this->dec_product * local_38);
      iVar3 = world::Town::getPopulation(this_01);
      iVar4 = world::Train::getGoods(local_40);
      if (len <= (iVar2 - (int)dVar8) / iVar3) {
        iVar2 = world::Town::predictProduct(this_01,homeLen);
        dVar8 = ceil(local_38 * this->dec_product);
        iVar3 = world::Town::getProductCapacity(this_01);
        if ((iVar2 + iVar4) - (int)dVar8 <= iVar3) goto LAB_00150852;
      }
    }
    else {
      iVar2 = world::Town::getArrmor(this_01);
      local_38 = this->dec_armor;
      iVar3 = world::Train::getGoods(local_40);
      if (len < 0x97) {
        dVar8 = ceil(local_38 * (double)len);
        iVar4 = world::Town::getArrmorCapacity(this_01);
        if ((iVar3 + iVar2) - (int)dVar8 <= iVar4) goto LAB_00150852;
      }
    }
    std::
    _Rb_tree<tiger::trains::world::Train_const*,tiger::trains::world::Train_const*,std::_Identity<tiger::trains::world::Train_const*>,std::less<tiger::trains::world::Train_const*>,std::allocator<tiger::trains::world::Train_const*>>
    ::_M_insert_unique<tiger::trains::world::Train_const*const&>
              ((_Rb_tree<tiger::trains::world::Train_const*,tiger::trains::world::Train_const*,std::_Identity<tiger::trains::world::Train_const*>,std::less<tiger::trains::world::Train_const*>,std::allocator<tiger::trains::world::Train_const*>>
                *)&this->goingHomeTrain,&local_40);
  }
  return bVar7;
}

Assistant:

bool HomeChecker::needHome(world::Train *train, int len, int homeLen, models::GoodType type)
{
    if (train->getGoods() == 0)
        return false;

    if (goingHomeTrain.count(train) != 0)
        return true;

    const world::Town *homeTown = (world::Town *)train->getPlayer()->getHome();

    if (type == models::GoodType::PRODUCT)
    {
        int predict = homeTown->getProduct() - (int)std::ceil(dec_product*len);
        int maxLen = predict / homeTown->getPopulation();
        int curProduct = train->getGoods();


        if (maxLen < len)
        {
            goingHomeTrain.insert(train);
            return true;
        }


        predict = homeTown->predictProduct(homeLen) -
                  (int)std::ceil(dec_product*len);

        if (curProduct + predict > homeTown->getProductCapacity())
        {
            goingHomeTrain.insert(train);
            return true;
        }

        return false;
    }
    else
    {
        int predict = homeTown->getArrmor() - (int)std::ceil(dec_armor*len);
        int maxLen = 150;
        int curProduct = train->getGoods();

        if (maxLen < len)
        {
            goingHomeTrain.insert(train);
            return true;
        }

        if (curProduct + predict > homeTown->getArrmorCapacity())
        {
            goingHomeTrain.insert(train);
            return true;
        }

        return false;
    }
}